

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_New_GlyphSlot(FT_Face face,FT_GlyphSlot *aslot)

{
  FT_Memory memory_00;
  FT_GlyphSlot slot_00;
  FT_GlyphSlot slot;
  FT_Memory memory;
  FT_Driver_Class clazz;
  FT_Driver driver;
  FT_GlyphSlot *ppFStack_20;
  FT_Error error;
  FT_GlyphSlot *aslot_local;
  FT_Face face_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if (face->driver == (FT_Driver)0x0) {
    face_local._4_4_ = 6;
  }
  else {
    memory_00 = (face->driver->root).memory;
    ppFStack_20 = aslot;
    aslot_local = (FT_GlyphSlot *)face;
    slot_00 = (FT_GlyphSlot)
              ft_mem_alloc(memory_00,face->driver->clazz->slot_object_size,
                           (FT_Error *)((long)&driver + 4));
    if (driver._4_4_ == 0) {
      slot_00->face = (FT_Face)aslot_local;
      driver._4_4_ = ft_glyphslot_init(slot_00);
      if (driver._4_4_ == 0) {
        slot_00->next = aslot_local[0x13];
        aslot_local[0x13] = slot_00;
        if (ppFStack_20 != (FT_GlyphSlot *)0x0) {
          *ppFStack_20 = slot_00;
        }
      }
      else {
        ft_glyphslot_done(slot_00);
        ft_mem_free(memory_00,slot_00);
      }
    }
    else if (ppFStack_20 != (FT_GlyphSlot *)0x0) {
      *ppFStack_20 = (FT_GlyphSlot)0x0;
    }
    face_local._4_4_ = driver._4_4_;
  }
  return face_local._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_New_GlyphSlot( FT_Face        face,
                    FT_GlyphSlot  *aslot )
  {
    FT_Error         error;
    FT_Driver        driver;
    FT_Driver_Class  clazz;
    FT_Memory        memory;
    FT_GlyphSlot     slot = NULL;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !face->driver )
      return FT_THROW( Invalid_Argument );

    driver = face->driver;
    clazz  = driver->clazz;
    memory = driver->root.memory;

    FT_TRACE4(( "FT_New_GlyphSlot: Creating new slot object\n" ));
    if ( !FT_ALLOC( slot, clazz->slot_object_size ) )
    {
      slot->face = face;

      error = ft_glyphslot_init( slot );
      if ( error )
      {
        ft_glyphslot_done( slot );
        FT_FREE( slot );
        goto Exit;
      }

      slot->next  = face->glyph;
      face->glyph = slot;

      if ( aslot )
        *aslot = slot;
    }
    else if ( aslot )
      *aslot = NULL;


  Exit:
    FT_TRACE4(( "FT_New_GlyphSlot: Return 0x%x\n", error ));

    return error;
  }